

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void BIT_addBits(BIT_CStream_t *bitC,size_t value,uint nbBits)

{
  uint uVar1;
  
  if (0x1f < nbBits) {
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                  ,0xb8,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
  }
  uVar1 = bitC->bitPos + nbBits;
  if (uVar1 < 0x40) {
    bitC->bitContainer =
         bitC->bitContainer | (ulong)((uint)value & BIT_mask[nbBits]) << ((byte)bitC->bitPos & 0x3f)
    ;
    bitC->bitPos = uVar1;
    return;
  }
  __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                ,0xb9,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

MEM_STATIC void BIT_addBits(BIT_CStream_t* bitC,
                            size_t value, unsigned nbBits)
{
    DEBUG_STATIC_ASSERT(BIT_MASK_SIZE == 32);
    assert(nbBits < BIT_MASK_SIZE);
    assert(nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    bitC->bitContainer |= BIT_getLowerBits(value, nbBits) << bitC->bitPos;
    bitC->bitPos += nbBits;
}